

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

bool __thiscall
jrtplib::RTPSources::CheckCollision
          (RTPSources *this,RTPInternalSourceData *srcdat,RTPAddress *senderaddress,bool isrtp)

{
  uint uVar1;
  RTPAddress *local_40;
  RTPAddress *otheraddr;
  RTPAddress *addr;
  bool otherisset;
  bool isset;
  bool isrtp_local;
  RTPAddress *senderaddress_local;
  RTPInternalSourceData *srcdat_local;
  RTPSources *this_local;
  
  if (isrtp) {
    addr._6_1_ = RTPSourceData::IsRTPAddressSet(&srcdat->super_RTPSourceData);
    otheraddr = RTPSourceData::GetRTPDataAddress(&srcdat->super_RTPSourceData);
    addr._5_1_ = RTPSourceData::IsRTCPAddressSet(&srcdat->super_RTPSourceData);
    local_40 = RTPSourceData::GetRTCPDataAddress(&srcdat->super_RTPSourceData);
  }
  else {
    addr._6_1_ = RTPSourceData::IsRTCPAddressSet(&srcdat->super_RTPSourceData);
    otheraddr = RTPSourceData::GetRTCPDataAddress(&srcdat->super_RTPSourceData);
    addr._5_1_ = RTPSourceData::IsRTPAddressSet(&srcdat->super_RTPSourceData);
    local_40 = RTPSourceData::GetRTPDataAddress(&srcdat->super_RTPSourceData);
  }
  if (addr._6_1_ == false) {
    if (addr._5_1_ == false) {
      if (isrtp) {
        RTPInternalSourceData::SetRTPDataAddress(srcdat,senderaddress);
      }
      else {
        RTPInternalSourceData::SetRTCPDataAddress(srcdat,senderaddress);
      }
    }
    else if (local_40 == (RTPAddress *)0x0) {
      if (senderaddress != (RTPAddress *)0x0) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[4])
                  (this,srcdat,senderaddress,(ulong)isrtp);
        return true;
      }
      if (isrtp) {
        RTPInternalSourceData::SetRTPDataAddress(srcdat,(RTPAddress *)0x0);
      }
      else {
        RTPInternalSourceData::SetRTCPDataAddress(srcdat,(RTPAddress *)0x0);
      }
    }
    else {
      uVar1 = (*local_40->_vptr_RTPAddress[2])(local_40,senderaddress);
      if ((uVar1 & 1) == 0) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[4])
                  (this,srcdat,senderaddress,(ulong)isrtp);
        return true;
      }
      if (isrtp) {
        RTPInternalSourceData::SetRTPDataAddress(srcdat,senderaddress);
      }
      else {
        RTPInternalSourceData::SetRTCPDataAddress(srcdat,senderaddress);
      }
    }
  }
  else if (otheraddr == (RTPAddress *)0x0) {
    if (senderaddress != (RTPAddress *)0x0) {
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[4])
                (this,srcdat,senderaddress,(ulong)isrtp);
      return true;
    }
  }
  else {
    uVar1 = (*otheraddr->_vptr_RTPAddress[1])(otheraddr,senderaddress);
    if ((uVar1 & 1) == 0) {
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[4])
                (this,srcdat,senderaddress,(ulong)isrtp);
      return true;
    }
  }
  return false;
}

Assistant:

bool RTPSources::CheckCollision(RTPInternalSourceData *srcdat,const RTPAddress *senderaddress,bool isrtp)
{
	bool isset,otherisset;
	const RTPAddress *addr,*otheraddr;
	
	if (isrtp)
	{
		isset = srcdat->IsRTPAddressSet();
		addr = srcdat->GetRTPDataAddress();
		otherisset = srcdat->IsRTCPAddressSet();
		otheraddr = srcdat->GetRTCPDataAddress();
	}
	else
	{
		isset = srcdat->IsRTCPAddressSet();
		addr = srcdat->GetRTCPDataAddress();
		otherisset = srcdat->IsRTPAddressSet();
		otheraddr = srcdat->GetRTPDataAddress();
	}

	if (!isset)
	{
		if (otherisset) // got other address, can check if it comes from same host
		{
			if (otheraddr == 0) // other came from our own session
			{
				if (senderaddress != 0)
				{
					OnSSRCCollision(srcdat,senderaddress,isrtp);
					return true;
				}

				// Ok, store it

				if (isrtp)
					srcdat->SetRTPDataAddress(senderaddress);
				else
					srcdat->SetRTCPDataAddress(senderaddress);
			}
			else
			{
				if (!otheraddr->IsFromSameHost(senderaddress))
				{
					OnSSRCCollision(srcdat,senderaddress,isrtp);
					return true;
				}

				// Ok, comes from same host, store the address

				if (isrtp)
					srcdat->SetRTPDataAddress(senderaddress);
				else
					srcdat->SetRTCPDataAddress(senderaddress);
			}
		}
		else // no other address, store this one
		{
			if (isrtp)
				srcdat->SetRTPDataAddress(senderaddress);
			else
				srcdat->SetRTCPDataAddress(senderaddress);
		}
	}
	else // already got an address
	{
		if (addr == 0)
		{
			if (senderaddress != 0)
			{
				OnSSRCCollision(srcdat,senderaddress,isrtp);
				return true;
			}
		}
		else
		{
			if (!addr->IsSameAddress(senderaddress))
			{
				OnSSRCCollision(srcdat,senderaddress,isrtp);
				return true;
			}
		}
	}
	
	return false;
}